

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::PointSorter::operator()
          (PointSorter *this,GeneratedPoint *a,GeneratedPoint *b)

{
  float fVar1;
  float fVar2;
  GeneratedPoint *b_local;
  GeneratedPoint *a_local;
  PointSorter *this_local;
  
  fVar1 = tcu::Vector<float,_2>::y(&a->center);
  fVar2 = tcu::Vector<float,_2>::y(&b->center);
  if (fVar2 <= fVar1) {
    fVar1 = tcu::Vector<float,_2>::y(&a->center);
    fVar2 = tcu::Vector<float,_2>::y(&b->center);
    if (fVar1 <= fVar2) {
      fVar1 = tcu::Vector<float,_2>::x(&a->center);
      fVar2 = tcu::Vector<float,_2>::x(&b->center);
      this_local._7_1_ = fVar1 < fVar2;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const PointRenderCase::GeneratedPoint& a, const PointRenderCase::GeneratedPoint& b) const
	{
		if (a.center.y() < b.center.y())
			return true;
		else if (a.center.y() > b.center.y())
			return false;
		else
			return (a.center.x() < b.center.x());
	}